

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint32_t direct_get_fs(aec_stream_conflict *strm)

{
  int iVar1;
  internal_state_conflict *piVar2;
  long lVar3;
  int iVar4;
  internal_state_conflict *state;
  int i;
  uint32_t fs;
  aec_stream_conflict *strm_local;
  
  fs = 0;
  piVar2 = strm->state;
  if (piVar2->bitp == 0) {
    piVar2->acc = 0;
  }
  else {
    piVar2->acc = 0xffffffffffffffffU >> (0x40U - (char)piVar2->bitp & 0x3f) & piVar2->acc;
  }
  while (piVar2->acc == 0) {
    piVar2->acc = piVar2->acc << 0x38 | (ulong)*strm->next_in << 0x30 |
                  (ulong)strm->next_in[1] << 0x28 | (ulong)strm->next_in[2] << 0x20 |
                  (ulong)strm->next_in[3] << 0x18 | (ulong)strm->next_in[4] << 0x10 |
                  (ulong)strm->next_in[5] << 8 | (ulong)strm->next_in[6];
    strm->next_in = strm->next_in + 7;
    strm->avail_in = strm->avail_in - 7;
    fs = piVar2->bitp + fs;
    piVar2->bitp = 0x38;
  }
  lVar3 = 0x3f;
  if (piVar2->acc != 0) {
    for (; piVar2->acc >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  iVar4 = 0x3f - ((uint)lVar3 ^ 0x3f);
  iVar1 = piVar2->bitp;
  piVar2->bitp = iVar4;
  return (iVar1 - iVar4) + -1 + fs;
}

Assistant:

static inline uint32_t direct_get_fs(struct aec_stream *strm)
{
    /**
       Interpret a Fundamental Sequence from the input buffer.

       Essentially counts the number of 0 bits until a 1 is
       encountered.
     */

    uint32_t fs = 0;
#if HAVE_BSR64
    unsigned long i;
#else
    int i;
#endif
    struct internal_state *state = strm->state;

    if (state->bitp)
        state->acc &= UINT64_MAX >> (64 - state->bitp);
    else
        state->acc = 0;

    while (state->acc == 0) {
        state->acc = (state->acc << 56)
            | ((uint64_t)strm->next_in[0] << 48)
            | ((uint64_t)strm->next_in[1] << 40)
            | ((uint64_t)strm->next_in[2] << 32)
            | ((uint64_t)strm->next_in[3] << 24)
            | ((uint64_t)strm->next_in[4] << 16)
            | ((uint64_t)strm->next_in[5] << 8)
            | (uint64_t)strm->next_in[6];
        strm->next_in += 7;
        strm->avail_in -= 7;
        fs += state->bitp;
        state->bitp = 56;
    }

#ifndef __has_builtin
#define __has_builtin(x) 0  /* Compatibility with non-clang compilers. */
#endif
#if HAVE_DECL___BUILTIN_CLZLL || __has_builtin(__builtin_clzll)
    i = 63 - __builtin_clzll(state->acc);
#elif HAVE_BSR64
    _BitScanReverse64(&i, state->acc);
#else
    i = state->bitp - 1;
    while ((state->acc & (UINT64_C(1) << i)) == 0)
        i--;
#endif
    fs += state->bitp - i - 1;
    state->bitp = i;
    return fs;
}